

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlNewDocNoDtD(xmlChar *URI,xmlChar *ExternalID)

{
  xmlDocPtr cur;
  xmlChar *ExternalID_local;
  xmlChar *URI_local;
  
  URI_local = (xmlChar *)(*xmlMalloc)(0xb0);
  if ((xmlDocPtr)URI_local == (xmlDocPtr)0x0) {
    htmlErrMemory((xmlParserCtxtPtr)0x0,"HTML document creation failed\n");
    URI_local = (xmlChar *)0x0;
  }
  else {
    memset(URI_local,0,0xb0);
    ((xmlDocPtr)URI_local)->type = XML_HTML_DOCUMENT_NODE;
    ((xmlDocPtr)URI_local)->version = (xmlChar *)0x0;
    ((xmlDocPtr)URI_local)->intSubset = (_xmlDtd *)0x0;
    ((xmlDocPtr)URI_local)->doc = (_xmlDoc *)URI_local;
    ((xmlDocPtr)URI_local)->name = (char *)0x0;
    ((xmlDocPtr)URI_local)->children = (_xmlNode *)0x0;
    ((xmlDocPtr)URI_local)->extSubset = (_xmlDtd *)0x0;
    ((xmlDocPtr)URI_local)->oldNs = (_xmlNs *)0x0;
    ((xmlDocPtr)URI_local)->encoding = (xmlChar *)0x0;
    ((xmlDocPtr)URI_local)->standalone = 1;
    ((xmlDocPtr)URI_local)->compression = 0;
    ((xmlDocPtr)URI_local)->ids = (void *)0x0;
    ((xmlDocPtr)URI_local)->refs = (void *)0x0;
    ((xmlDocPtr)URI_local)->_private = (void *)0x0;
    ((xmlDocPtr)URI_local)->charset = 1;
    ((xmlDocPtr)URI_local)->properties = 0xa0;
    if ((ExternalID != (xmlChar *)0x0) || (URI != (xmlChar *)0x0)) {
      xmlCreateIntSubset((xmlDocPtr)URI_local,"html",ExternalID,URI);
    }
  }
  return (htmlDocPtr)URI_local;
}

Assistant:

htmlDocPtr
htmlNewDocNoDtD(const xmlChar *URI, const xmlChar *ExternalID) {
    xmlDocPtr cur;

    /*
     * Allocate a new document and fill the fields.
     */
    cur = (xmlDocPtr) xmlMalloc(sizeof(xmlDoc));
    if (cur == NULL) {
	htmlErrMemory(NULL, "HTML document creation failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlDoc));

    cur->type = XML_HTML_DOCUMENT_NODE;
    cur->version = NULL;
    cur->intSubset = NULL;
    cur->doc = cur;
    cur->name = NULL;
    cur->children = NULL;
    cur->extSubset = NULL;
    cur->oldNs = NULL;
    cur->encoding = NULL;
    cur->standalone = 1;
    cur->compression = 0;
    cur->ids = NULL;
    cur->refs = NULL;
    cur->_private = NULL;
    cur->charset = XML_CHAR_ENCODING_UTF8;
    cur->properties = XML_DOC_HTML | XML_DOC_USERBUILT;
    if ((ExternalID != NULL) ||
	(URI != NULL))
	xmlCreateIntSubset(cur, BAD_CAST "html", ExternalID, URI);
    return(cur);
}